

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

float v_scroll_percent_visible_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  float local_30;
  float val;
  float local_1c;
  float innerh;
  Am_Object group;
  Am_Object *self_local;
  
  group.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  pAVar1 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe8,399,0);
  local_1c = Am_Value::operator_cast_to_float(pAVar1);
  if ((local_1c == 0.0) && (!NAN(local_1c))) {
    local_1c = 1.0;
  }
  pAVar1 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe8,0x1c2,0);
  local_30 = Am_Value::operator_cast_to_float(pAVar1);
  local_30 = local_30 / local_1c;
  if (1.0 < local_30) {
    local_30 = 1.0;
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return local_30;
}

Assistant:

Am_Define_Formula(float, v_scroll_percent_visible)
{
  Am_Object group = self.Get_Owner();
  float innerh = group.Get(Am_INNER_HEIGHT);
  if (innerh == 0.0f)
    innerh = 1.0f;
  float val = (float)group.Get(Am_CLIP_HEIGHT) / innerh;
  if (val > 1.0)
    val = 1.0f;
  return val;
}